

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_filter_bank_analysis.cc
# Opt level: O0

bool __thiscall
sptk::MelFilterBankAnalysis::GetCenterFrequencies
          (MelFilterBankAnalysis *this,vector<double,_std::allocator<double>_> *center_frequencies)

{
  size_type sVar1;
  reference pvVar2;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar3;
  int m;
  int local_1c;
  vector<double,_std::allocator<double>_> *this_00;
  bool local_1;
  
  if ((((ulong)in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start & 0x100) == 0) ||
     (in_RSI == (vector<double,_std::allocator<double>_> *)0x0)) {
    local_1 = false;
  }
  else {
    this_00 = in_RDI;
    sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
    if (sVar1 != (long)(*(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>
                                        )._M_impl.super__Vector_impl_data._M_finish + 4) + 1)) {
      std::vector<double,_std::allocator<double>_>::resize(this_00,(size_type)in_RSI);
    }
    for (local_1c = 0;
        local_1c <=
        *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish + 4); local_1c = local_1c + 1) {
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)
                 &in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(long)local_1c);
      dVar3 = anon_unknown.dwarf_9681::MelToHz(5.38005868119784e-318);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_1c);
      *pvVar2 = dVar3;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool MelFilterBankAnalysis::GetCenterFrequencies(
    std::vector<double>* center_frequencies) const {
  if (!is_valid_ || NULL == center_frequencies) {
    return false;
  }

  if (center_frequencies->size() !=
      static_cast<std::size_t>(num_channel_ + 1)) {
    center_frequencies->resize(num_channel_ + 1);
  }

  for (int m(0); m <= num_channel_; ++m) {
    (*center_frequencies)[m] = MelToHz(center_frequencies_[m]);
  }

  return true;
}